

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

float GetPredictionCostCrossColorBlue
                (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                VP8LMultipliers prev_y,int green_to_blue,int red_to_blue,int *accumulated_blue_histo
                )

{
  float fVar1;
  int histo [256];
  int local_438 [258];
  
  memset(local_438,0,0x400);
  (*VP8LCollectColorBlueTransforms)
            (argb,stride,tile_width,tile_height,green_to_blue,red_to_blue,local_438);
  fVar1 = PredictionCostCrossColor(accumulated_blue_histo,local_438);
  if ((green_to_blue & 0xffU) == (prev_x._1_2_ & 0xff)) {
    fVar1 = fVar1 + -3.0;
  }
  if ((green_to_blue & 0xffU) == (prev_y._1_2_ & 0xff)) {
    fVar1 = fVar1 + -3.0;
  }
  if ((red_to_blue & 0xffU) == (uint)((uint3)prev_x >> 0x10)) {
    fVar1 = fVar1 + -3.0;
  }
  if ((red_to_blue & 0xffU) == (uint)((uint3)prev_y >> 0x10)) {
    fVar1 = fVar1 + -3.0;
  }
  if (green_to_blue == 0) {
    fVar1 = fVar1 + -3.0;
  }
  if (red_to_blue == 0) {
    fVar1 = fVar1 + -3.0;
  }
  return fVar1;
}

Assistant:

static float GetPredictionCostCrossColorBlue(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y,
    int green_to_blue, int red_to_blue, const int accumulated_blue_histo[256]) {
  int histo[256] = { 0 };
  float cur_diff;

  VP8LCollectColorBlueTransforms(argb, stride, tile_width, tile_height,
                                 green_to_blue, red_to_blue, histo);

  cur_diff = PredictionCostCrossColor(accumulated_blue_histo, histo);
  if ((uint8_t)green_to_blue == prev_x.green_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)green_to_blue == prev_y.green_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)red_to_blue == prev_x.red_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)red_to_blue == prev_y.red_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if (green_to_blue == 0) {
    cur_diff -= 3;
  }
  if (red_to_blue == 0) {
    cur_diff -= 3;
  }
  return cur_diff;
}